

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamDens.cpp
# Opt level: O0

void __thiscall
OpenMD::TetrahedralityParamDens::TetrahedralityParamDens
          (TetrahedralityParamDens *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          double rCut,int ndensbins)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  undefined1 uVar1;
  undefined1 uVar2;
  string *in_RCX;
  SelectionEvaluator *in_RDI;
  string *in_R8;
  undefined4 in_R9D;
  SelectionEvaluator *in_XMM0_Qa;
  SimInfo *in_stack_00000178;
  SelectionManager *in_stack_00000180;
  undefined8 in_stack_fffffffffffffec8;
  string *psVar3;
  StaticAnalyser *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  pointer *this_00;
  SelectionEvaluator *this_01;
  string local_d0 [32];
  string local_b0 [36];
  undefined4 local_8c;
  int *local_88;
  int *local_80;
  undefined4 in_stack_ffffffffffffffc8;
  
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)in_stack_fffffffffffffee0._M_current,
             (SimInfo *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (string *)in_stack_fffffffffffffed0,(uint)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  *(undefined ***)&(in_RDI->compiler).filename = &PTR__TetrahedralityParamDens_00560438;
  std::__cxx11::string::string((string *)&(in_RDI->compiler).cchScript,in_RCX);
  psVar3 = (string *)
           &(in_RDI->compiler).atokenCommand.
            super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)psVar3,in_R8);
  SelectionManager::SelectionManager(in_stack_00000180,in_stack_00000178);
  this_01 = (SelectionEvaluator *)&(in_RDI->errorMessage).field_2;
  SelectionManager::SelectionManager(in_stack_00000180,in_stack_00000178);
  SelectionEvaluator::SelectionEvaluator
            (in_XMM0_Qa,(SimInfo *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
  SelectionEvaluator::SelectionEvaluator
            (in_XMM0_Qa,(SimInfo *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
  in_RDI[2].distanceFinder.torsions_.
  super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_XMM0_Qa;
  this_00 = &in_RDI[2].distanceFinder.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1e0aaa);
  SelectionEvaluator::loadScriptString(in_RDI,psVar3);
  uVar1 = SelectionEvaluator::isDynamic
                    ((SelectionEvaluator *)
                     &(in_RDI->distanceFinder).torsions_.
                      super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!(bool)uVar1) {
    in_stack_fffffffffffffee0._M_current =
         (int *)&(in_RDI->compiler).ltokenPostfix.
                 super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffee0._M_current,
               (SelectionSet *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    SelectionSet::~SelectionSet((SelectionSet *)0x1e0b34);
  }
  SelectionEvaluator::loadScriptString(in_RDI,psVar3);
  uVar2 = SelectionEvaluator::isDynamic
                    ((SelectionEvaluator *)
                     &in_RDI[1].distanceFinder.torsions_.
                      super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!(bool)uVar2) {
    in_stack_fffffffffffffed0 = (StaticAnalyser *)&(in_RDI->errorMessage).field_2;
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffee0._M_current,
               (SelectionSet *)CONCAT17(uVar2,in_stack_fffffffffffffed8));
    SelectionSet::~SelectionSet((SelectionSet *)0x1e0c94);
  }
  in_RDI[2].distanceFinder.inversions_.
  super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc008000000000000;
  in_RDI[2].distanceFinder.inversions_.
  super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff199999999999a;
  in_RDI[2].distanceFinder.molecules_.
  super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((double)in_RDI[2].distanceFinder.inversions_.
                          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                 (double)in_RDI[2].distanceFinder.inversions_.
                         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish) /
                (double)*(uint *)((long)&(in_RDI->compiler).script.field_2 + 4));
  *(undefined4 *)
   &in_RDI[2].distanceFinder.molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,CONCAT17(uVar1,in_stack_fffffffffffffee8))
  ;
  psVar3 = (string *)
           &in_RDI[2].distanceFinder.molecules_.
            super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  local_80 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)psVar3);
  local_88 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)psVar3);
  local_8c = 0;
  __last._M_current._7_1_ = uVar2;
  __last._M_current._0_7_ = in_stack_fffffffffffffed8;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffffee0,__last,(int *)in_stack_fffffffffffffed0);
  getPrefix((string *)CONCAT17(uVar2,in_stack_fffffffffffffed8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar2,in_stack_fffffffffffffed8),(char *)in_stack_fffffffffffffed0);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffed0,psVar3);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  return;
}

Assistant:

TetrahedralityParamDens::TetrahedralityParamDens(SimInfo* info,
                                                   const std::string& filename,
                                                   const std::string& sele1,
                                                   const std::string& sele2,
                                                   double rCut, int ndensbins) :
      StaticAnalyser(info, filename, ndensbins),
      selectionScript1_(sele1), selectionScript2_(sele2), seleMan1_(info),
      seleMan2_(info), evaluator1_(info), evaluator2_(info), rCut_(rCut) {
    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    // Q can take values of 0 to 1.
    MinQ_   = -3.0;
    MaxQ_   = 1.1;
    deltaQ_ = (MaxQ_ - MinQ_) / nBins_;

    // zeroing the number of molecules investigated counter
    count_ = 0;

    // fixed number of bins
    sliceCount_.resize(nBins_);
    std::fill(sliceCount_.begin(), sliceCount_.end(), 0);

    setOutputName(getPrefix(filename) + ".Qdens");
  }